

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O3

void rlglClose(void)

{
  RenderBatch in_stack_00000000;
  
  rlUnloadRenderBatch(in_stack_00000000);
  (*glad_glUseProgram)(0);
  (*glad_glDetachShader)(RLGL.State.defaultShader.id,RLGL.State.defaultVShaderId);
  (*glad_glDetachShader)(RLGL.State.defaultShader.id,RLGL.State.defaultFShaderId);
  (*glad_glDeleteShader)(RLGL.State.defaultVShaderId);
  (*glad_glDeleteShader)(RLGL.State.defaultFShaderId);
  (*glad_glDeleteProgram)(RLGL.State.defaultShader.id);
  free(RLGL.State.defaultShader.locs);
  TraceLog(3,"SHADER: [ID %i] Default shader unloaded successfully",
           (ulong)RLGL.State.defaultShader.id);
  (*glad_glDeleteTextures)(1,(GLuint *)0x1c1e00);
  TraceLog(3,"TEXTURE: [ID %i] Default texture unloaded successfully",
           (ulong)RLGL.State.defaultTextureId);
  return;
}

Assistant:

void rlglClose(void)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    rlUnloadRenderBatch(RLGL.defaultBatch);

    rlUnloadShaderDefault();          // Unload default shader

    glDeleteTextures(1, &RLGL.State.defaultTextureId); // Unload default texture
    TRACELOG(LOG_INFO, "TEXTURE: [ID %i] Default texture unloaded successfully", RLGL.State.defaultTextureId);
#endif
}